

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void mbedtls_sha1(uchar *input,size_t ilen,uchar *output)

{
  undefined1 local_7c [8];
  mbedtls_sha1_context ctx;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  
  ctx.buffer._56_8_ = output;
  mbedtls_sha1_init((mbedtls_sha1_context *)local_7c);
  mbedtls_sha1_starts((mbedtls_sha1_context *)local_7c);
  mbedtls_sha1_update((mbedtls_sha1_context *)local_7c,input,ilen);
  mbedtls_sha1_finish((mbedtls_sha1_context *)local_7c,(uchar *)ctx.buffer._56_8_);
  mbedtls_sha1_free((mbedtls_sha1_context *)local_7c);
  return;
}

Assistant:

void mbedtls_sha1( const unsigned char *input, size_t ilen, unsigned char output[20] )
{
    mbedtls_sha1_context ctx;

    mbedtls_sha1_init( &ctx );
    mbedtls_sha1_starts( &ctx );
    mbedtls_sha1_update( &ctx, input, ilen );
    mbedtls_sha1_finish( &ctx, output );
    mbedtls_sha1_free( &ctx );
}